

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::SolverParameter::MergeFrom(SolverParameter *this,SolverParameter *from)

{
  uint32 *puVar1;
  uint uVar2;
  void *pvVar3;
  LogMessage *other;
  NetParameter *pNVar4;
  NetState *this_00;
  NetParameter *pNVar5;
  NetState *from_00;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x2171);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->test_net_).super_RepeatedPtrFieldBase,
             &(from->test_net_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<int>::MergeFrom(&this->test_iter_,&from->test_iter_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetParameter>::TypeHandler>
            (&(this->test_net_param_).super_RepeatedPtrFieldBase,
             &(from->test_net_param_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetState>::TypeHandler>
            (&(this->test_state_).super_RepeatedPtrFieldBase,
             &(from->test_state_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<int>::MergeFrom(&this->stepvalue_,&from->stepvalue_);
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->train_net_,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->train_net_).ptr_);
    }
    if ((uVar2 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->lr_policy_,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->lr_policy_).ptr_);
    }
    if ((uVar2 & 4) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->snapshot_prefix_,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->snapshot_prefix_).ptr_);
    }
    if ((uVar2 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->net_,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->net_).ptr_);
    }
    if ((uVar2 & 0x10) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->regularization_type_,(string *)&_default_regularization_type__abi_cxx11_,
                 (from->regularization_type_).ptr_);
    }
    if ((uVar2 & 0x20) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->type_,(string *)&_default_type__abi_cxx11_,(from->type_).ptr_);
    }
    if ((uVar2 & 0x40) != 0) {
      pNVar4 = mutable_train_net_param(this);
      pNVar5 = from->train_net_param_;
      if (pNVar5 == (NetParameter *)0x0) {
        pNVar5 = (NetParameter *)&_NetParameter_default_instance_;
      }
      NetParameter::MergeFrom(pNVar4,pNVar5);
    }
    if ((char)uVar2 < '\0') {
      pNVar4 = mutable_net_param(this);
      pNVar5 = from->net_param_;
      if (pNVar5 == (NetParameter *)0x0) {
        pNVar5 = (NetParameter *)&_NetParameter_default_instance_;
      }
      NetParameter::MergeFrom(pNVar4,pNVar5);
    }
  }
  if ((uVar2 & 0xff00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      this_00 = mutable_train_state(this);
      from_00 = from->train_state_;
      if (from_00 == (NetState *)0x0) {
        from_00 = (NetState *)&_NetState_default_instance_;
      }
      NetState::MergeFrom(this_00,from_00);
    }
    if ((uVar2 >> 9 & 1) != 0) {
      this->test_interval_ = from->test_interval_;
    }
    if ((uVar2 >> 10 & 1) != 0) {
      this->base_lr_ = from->base_lr_;
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      this->display_ = from->display_;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      this->max_iter_ = from->max_iter_;
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      this->gamma_ = from->gamma_;
    }
    if ((uVar2 >> 0xe & 1) != 0) {
      this->power_ = from->power_;
    }
    if ((short)uVar2 < 0) {
      this->momentum_ = from->momentum_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  if ((uVar2 & 0xff0000) != 0) {
    if ((uVar2 >> 0x10 & 1) != 0) {
      this->weight_decay_ = from->weight_decay_;
    }
    if ((uVar2 >> 0x11 & 1) != 0) {
      this->stepsize_ = from->stepsize_;
    }
    if ((uVar2 >> 0x12 & 1) != 0) {
      this->snapshot_ = from->snapshot_;
    }
    if ((uVar2 >> 0x13 & 1) != 0) {
      this->device_id_ = from->device_id_;
    }
    if ((uVar2 >> 0x14 & 1) != 0) {
      this->test_compute_loss_ = from->test_compute_loss_;
    }
    if ((uVar2 >> 0x15 & 1) != 0) {
      this->snapshot_diff_ = from->snapshot_diff_;
    }
    if ((uVar2 >> 0x16 & 1) != 0) {
      this->debug_info_ = from->debug_info_;
    }
    if ((uVar2 >> 0x17 & 1) != 0) {
      this->solver_type_ = from->solver_type_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  if (0xffffff < uVar2) {
    if ((uVar2 >> 0x18 & 1) != 0) {
      this->momentum2_ = from->momentum2_;
    }
    if ((uVar2 >> 0x19 & 1) != 0) {
      this->random_seed_ = from->random_seed_;
    }
    if ((uVar2 >> 0x1a & 1) != 0) {
      this->solver_mode_ = from->solver_mode_;
    }
    if ((uVar2 >> 0x1b & 1) != 0) {
      this->test_initialization_ = from->test_initialization_;
    }
    if ((uVar2 >> 0x1c & 1) != 0) {
      this->snapshot_after_train_ = from->snapshot_after_train_;
    }
    if ((uVar2 >> 0x1d & 1) != 0) {
      this->delta_ = from->delta_;
    }
    if ((uVar2 >> 0x1e & 1) != 0) {
      this->average_loss_ = from->average_loss_;
    }
    if ((int)uVar2 < 0) {
      this->clip_gradients_ = from->clip_gradients_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  uVar2 = (from->_has_bits_).has_bits_[1];
  if ((uVar2 & 7) != 0) {
    if ((uVar2 & 1) != 0) {
      this->iter_size_ = from->iter_size_;
    }
    if ((uVar2 & 2) != 0) {
      this->snapshot_format_ = from->snapshot_format_;
    }
    if ((uVar2 & 4) != 0) {
      this->rms_decay_ = from->rms_decay_;
    }
    puVar1 = (this->_has_bits_).has_bits_ + 1;
    *puVar1 = *puVar1 | uVar2;
  }
  return;
}

Assistant:

void SolverParameter::MergeFrom(const SolverParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.SolverParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  test_net_.MergeFrom(from.test_net_);
  test_iter_.MergeFrom(from.test_iter_);
  test_net_param_.MergeFrom(from.test_net_param_);
  test_state_.MergeFrom(from.test_state_);
  stepvalue_.MergeFrom(from.stepvalue_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_train_net();
      train_net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.train_net_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_lr_policy();
      lr_policy_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.lr_policy_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_snapshot_prefix();
      snapshot_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.snapshot_prefix_);
    }
    if (cached_has_bits & 0x00000008u) {
      set_has_net();
      net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.net_);
    }
    if (cached_has_bits & 0x00000010u) {
      set_has_regularization_type();
      regularization_type_.AssignWithDefault(&SolverParameter::_default_regularization_type_.get(), from.regularization_type_);
    }
    if (cached_has_bits & 0x00000020u) {
      set_has_type();
      type_.AssignWithDefault(&SolverParameter::_default_type_.get(), from.type_);
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_train_net_param()->::caffe::NetParameter::MergeFrom(from.train_net_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_net_param()->::caffe::NetParameter::MergeFrom(from.net_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_train_state()->::caffe::NetState::MergeFrom(from.train_state());
    }
    if (cached_has_bits & 0x00000200u) {
      test_interval_ = from.test_interval_;
    }
    if (cached_has_bits & 0x00000400u) {
      base_lr_ = from.base_lr_;
    }
    if (cached_has_bits & 0x00000800u) {
      display_ = from.display_;
    }
    if (cached_has_bits & 0x00001000u) {
      max_iter_ = from.max_iter_;
    }
    if (cached_has_bits & 0x00002000u) {
      gamma_ = from.gamma_;
    }
    if (cached_has_bits & 0x00004000u) {
      power_ = from.power_;
    }
    if (cached_has_bits & 0x00008000u) {
      momentum_ = from.momentum_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 16711680u) {
    if (cached_has_bits & 0x00010000u) {
      weight_decay_ = from.weight_decay_;
    }
    if (cached_has_bits & 0x00020000u) {
      stepsize_ = from.stepsize_;
    }
    if (cached_has_bits & 0x00040000u) {
      snapshot_ = from.snapshot_;
    }
    if (cached_has_bits & 0x00080000u) {
      device_id_ = from.device_id_;
    }
    if (cached_has_bits & 0x00100000u) {
      test_compute_loss_ = from.test_compute_loss_;
    }
    if (cached_has_bits & 0x00200000u) {
      snapshot_diff_ = from.snapshot_diff_;
    }
    if (cached_has_bits & 0x00400000u) {
      debug_info_ = from.debug_info_;
    }
    if (cached_has_bits & 0x00800000u) {
      solver_type_ = from.solver_type_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 4278190080u) {
    if (cached_has_bits & 0x01000000u) {
      momentum2_ = from.momentum2_;
    }
    if (cached_has_bits & 0x02000000u) {
      random_seed_ = from.random_seed_;
    }
    if (cached_has_bits & 0x04000000u) {
      solver_mode_ = from.solver_mode_;
    }
    if (cached_has_bits & 0x08000000u) {
      test_initialization_ = from.test_initialization_;
    }
    if (cached_has_bits & 0x10000000u) {
      snapshot_after_train_ = from.snapshot_after_train_;
    }
    if (cached_has_bits & 0x20000000u) {
      delta_ = from.delta_;
    }
    if (cached_has_bits & 0x40000000u) {
      average_loss_ = from.average_loss_;
    }
    if (cached_has_bits & 0x80000000u) {
      clip_gradients_ = from.clip_gradients_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  cached_has_bits = from._has_bits_[1];
  if (cached_has_bits & 7u) {
    if (cached_has_bits & 0x00000001u) {
      iter_size_ = from.iter_size_;
    }
    if (cached_has_bits & 0x00000002u) {
      snapshot_format_ = from.snapshot_format_;
    }
    if (cached_has_bits & 0x00000004u) {
      rms_decay_ = from.rms_decay_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
}